

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::ItemSimilarityRecommender_SimilarItems::MergeFrom
          (ItemSimilarityRecommender_SimilarItems *this,ItemSimilarityRecommender_SimilarItems *from
          )

{
  double dVar1;
  void *pvVar2;
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O2/mlmodel/format/ItemSimilarityRecommender.pb.cc"
               ,0x21a);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::ItemSimilarityRecommender_ConnectedItem>::TypeHandler>
            (&(this->similaritemlist_).super_RepeatedPtrFieldBase,
             &(from->similaritemlist_).super_RepeatedPtrFieldBase);
  if (from->itemid_ != 0) {
    this->itemid_ = from->itemid_;
  }
  dVar1 = from->itemscoreadjustment_;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    this->itemscoreadjustment_ = dVar1;
  }
  return;
}

Assistant:

void ItemSimilarityRecommender_SimilarItems::MergeFrom(const ItemSimilarityRecommender_SimilarItems& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.ItemSimilarityRecommender.SimilarItems)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  similaritemlist_.MergeFrom(from.similaritemlist_);
  if (from.itemid() != 0) {
    set_itemid(from.itemid());
  }
  if (from.itemscoreadjustment() != 0) {
    set_itemscoreadjustment(from.itemscoreadjustment());
  }
}